

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O1

bool __thiscall re2::SparseArray<int>::has_index(SparseArray<int> *this,int i)

{
  uint uVar1;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false> _Var2;
  bool bVar3;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/sparse_array.h"
                  ,0x15e,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  _Var2._M_head_impl.len_ = (Deleter)0;
  if ((this->dense_).ptr_._M_t.
      super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl !=
      (IndexValue *)0x0) {
    _Var2._M_head_impl.len_ =
         (this->dense_).ptr_._M_t.
         super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
         .super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>.
         super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>.
         _M_head_impl;
  }
  if (i < (int)_Var2._M_head_impl.len_) {
    if (((uint)i < (uint)_Var2._M_head_impl.len_) &&
       (uVar1 = (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
                _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)i], uVar1 < (uint)this->size_
       )) {
      bVar3 = (this->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
              [(int)uVar1].index_ == i;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("i < max_size()",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/sparse_array.h"
                ,0x15f,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  assert(i >= 0);
  assert(i < max_size());
  if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_[i] < 0.
  return (uint32_t)sparse_[i] < (uint32_t)size_ &&
         dense_[sparse_[i]].index_ == i;
}